

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O0

double __thiscall spdlog::logger::log(logger *this,double __x)

{
  string_view_t view;
  bool bVar1;
  level_enum in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  char *in_R8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar3;
  source_loc loc;
  exception *ex;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined1 local_88 [8];
  log_msg log_msg;
  char *msg_local;
  level_enum lvl_local;
  logger *this_local;
  source_loc source_local;
  
  log_msg.payload._M_str = in_R8;
  bVar1 = should_log(this,in_ECX);
  uVar2 = extraout_XMM0_Da;
  uVar3 = extraout_XMM0_Db;
  if (bVar1) {
    local_98 = in_RSI;
    uStack_90 = in_EDX;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_a8,log_msg.payload._M_str);
    loc.line = uStack_90;
    loc.filename = (char *)local_98;
    view._M_str = local_a8._M_str;
    view._M_len = local_a8._M_len;
    loc._12_4_ = 0;
    details::log_msg::log_msg((log_msg *)local_88,loc,&this->name_,in_ECX,view);
    (*this->_vptr_logger[3])(this,local_88);
    uVar2 = extraout_XMM0_Da_00;
    uVar3 = extraout_XMM0_Db_00;
  }
  return (double)CONCAT44(uVar3,uVar2);
}

Assistant:

inline void spdlog::logger::log(source_loc source, level::level_enum lvl, const char *msg)
{
    if (!should_log(lvl))
    {
        return;
    }

    try
    {
        details::log_msg log_msg(source, &name_, lvl, spdlog::string_view_t(msg));
        sink_it_(log_msg);
    }
    SPDLOG_CATCH_AND_HANDLE
}